

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeOneCE
          (CollationDataBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  uint32_t uVar1;
  int32_t iVar2;
  
  uVar1 = encodeOneCEAsCE32(ce);
  if (uVar1 == 1) {
    iVar2 = addCE(this,ce,errorCode);
    uVar1 = 0;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (iVar2 < 0x80000) {
        uVar1 = iVar2 << 0xd | 0x1c6;
      }
      else {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
  }
  return uVar1;
}

Assistant:

uint32_t
CollationDataBuilder::encodeOneCE(int64_t ce, UErrorCode &errorCode) {
    // Try to encode one CE as one CE32.
    uint32_t ce32 = encodeOneCEAsCE32(ce);
    if(ce32 != Collation::NO_CE32) { return ce32; }
    int32_t index = addCE(ce, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, index, 1);
}